

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O0

Expression *
slang::ast::CallExpression::fromSyntaxImpl
          (Compilation *compilation,ExpressionSyntax *left,InvocationExpressionSyntax *invocation,
          ArrayOrRandomizeMethodExpressionSyntax *withClause,ASTContext *context)

{
  bool bVar1;
  Compilation *compilation_00;
  long in_RDX;
  SyntaxNode *in_RSI;
  SyntaxNode *in_R8;
  SourceRange SVar2;
  Diagnostic *diag;
  SourceLocation loc;
  ASTContext *in_stack_00000ae8;
  ArrayOrRandomizeMethodExpressionSyntax *in_stack_00000af0;
  InvocationExpressionSyntax *in_stack_00000af8;
  NameSyntax *in_stack_00000b00;
  Compilation *in_stack_00000b08;
  Expression *in_stack_ffffffffffffff78;
  SourceLocation in_stack_ffffffffffffff88;
  ASTContext *in_stack_ffffffffffffff90;
  SourceLocation in_stack_ffffffffffffff98;
  SyntaxNode *in_stack_ffffffffffffffb0;
  Token local_48;
  SourceLocation local_38;
  Expression *local_8;
  
  if (in_RSI->kind == MemberAccessExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::MemberAccessExpressionSyntax>(in_RSI);
    local_8 = MemberAccessExpression::fromSyntax
                        (compilation,(MemberAccessExpressionSyntax *)left,invocation,withClause,
                         context);
  }
  else {
    bVar1 = slang::syntax::NameSyntax::isKind(in_RSI->kind);
    if (bVar1) {
      slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(in_RSI);
      local_8 = Expression::bindName
                          (in_stack_00000b08,in_stack_00000b00,in_stack_00000af8,in_stack_00000af0,
                           in_stack_00000ae8);
    }
    else {
      if ((in_RDX == 0) || (*(long *)(in_RDX + 0x58) == 0)) {
        local_48 = slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffffb0);
        local_38 = parsing::Token::location(&local_48);
      }
      else {
        local_38 = parsing::Token::location((Token *)(*(long *)(in_RDX + 0x58) + 0x18));
      }
      compilation_00 =
           (Compilation *)
           ASTContext::addDiag(in_stack_ffffffffffffff90,local_38._4_4_,in_stack_ffffffffffffff98);
      SVar2 = slang::syntax::SyntaxNode::sourceRange(in_R8);
      SVar2.endLoc = SVar2.startLoc;
      SVar2.startLoc = in_stack_ffffffffffffff88;
      Diagnostic::operator<<((Diagnostic *)compilation_00,SVar2);
      local_8 = Expression::badExpr(compilation_00,in_stack_ffffffffffffff78);
    }
  }
  return local_8;
}

Assistant:

Expression& CallExpression::fromSyntaxImpl(Compilation& compilation, const ExpressionSyntax& left,
                                           const InvocationExpressionSyntax* invocation,
                                           const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                           const ASTContext& context) {
    if (left.kind == SyntaxKind::MemberAccessExpression) {
        return MemberAccessExpression::fromSyntax(compilation,
                                                  left.as<MemberAccessExpressionSyntax>(),
                                                  invocation, withClause, context);
    }

    if (!NameSyntax::isKind(left.kind)) {
        SourceLocation loc = (invocation && invocation->arguments)
                                 ? invocation->arguments->openParen.location()
                                 : left.getFirstToken().location();
        auto& diag = context.addDiag(diag::ExpressionNotCallable, loc);
        diag << left.sourceRange();
        return badExpr(compilation, nullptr);
    }

    return bindName(compilation, left.as<NameSyntax>(), invocation, withClause, context);
}